

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

void __thiscall
indk::NeuralNet::
doSignalTransferAsync(std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>const&,std::function<void(std::vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>)>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
::$_0::~__0(__0 *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(this + 0x40));
  if (*(code **)(this + 0x30) != (code *)0x0) {
    (**(code **)(this + 0x30))(this + 0x20,this + 0x20,3);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)(this + 8));
  return;
}

Assistant:

void indk::NeuralNet::doSignalTransferAsync(const std::vector<std::vector<float>>& Xx, const std::function<void(std::vector<indk::OutputValue>)>& callback, const std::vector<std::string>& inputs) {
    std::function<void()> tCallback([this, Xx, callback, inputs] () {
        auto Y = doSignalTransfer(Xx, inputs);

        if (callback) {
            callback(Y);
        }
    });
    std::thread CallbackThread(tCallback);
    CallbackThread.detach();
}